

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ithipublisher.cpp
# Opt level: O1

bool __thiscall
ithipublisher::GetNameOrNumberList
          (ithipublisher *this,char *metric_name,
          vector<_metric_name_line,_std::allocator<_metric_name_line>_> *name_list,bool is_number)

{
  pointer pp_Var1;
  _metric_line *p_Var2;
  iterator iVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  pointer pp_Var10;
  undefined7 in_register_00000009;
  _metric_name_line *p_Var11;
  _metric_name_line *p_Var12;
  ulong uVar13;
  _metric_name_line *p_Var14;
  __normal_iterator<_metric_name_line_*,_std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>_>
  __first;
  __normal_iterator<_metric_name_line_*,_std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>_>
  _Var15;
  _metric_name_line *p_Var16;
  __normal_iterator<_metric_name_line_*,_std::vector<_metric_name_line,_std::allocator<_metric_name_line>_>_>
  _Var17;
  size_t __n;
  double dVar18;
  value_type __val;
  _metric_name_line local_88;
  _metric_name_line *local_68;
  _metric_name_line *local_60;
  char *local_58;
  double dStack_50;
  double local_48;
  _metric_name_line *local_38;
  
  local_60 = (_metric_name_line *)
             CONCAT44(local_60._4_4_,(int)CONCAT71(in_register_00000009,is_number));
  local_88.name = (char *)0x0;
  local_88.current = 0.0;
  local_88.average = 0.0;
  pp_Var10 = (this->line_list).super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pp_Var1 = (this->line_list).super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar13 = 0;
  local_68 = (_metric_name_line *)name_list;
  do {
    if ((ulong)((long)pp_Var1 - (long)pp_Var10 >> 3) <= uVar13) break;
    p_Var2 = pp_Var10[uVar13];
    iVar8 = strcmp(p_Var2->metric_name,metric_name);
    if (iVar8 < 1) {
      if (iVar8 == 0) {
        local_88.name = p_Var2->key_value;
        goto LAB_00169043;
      }
      uVar13 = uVar13 + 1;
      bVar7 = true;
    }
    else {
LAB_00169043:
      bVar7 = false;
    }
  } while (bVar7);
  p_Var14 = local_68;
  pp_Var10 = (this->line_list).super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  dVar18 = 0.0;
  if (uVar13 < (ulong)((long)(this->line_list).
                             super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pp_Var10 >> 3)) {
    do {
      p_Var2 = pp_Var10[uVar13];
      iVar8 = strcmp(p_Var2->metric_name,metric_name);
      if (iVar8 != 0) break;
      if ((local_88.name != (char *)0x0) &&
         (iVar8 = strcmp(p_Var2->key_value,local_88.name), iVar8 != 0)) {
        if (1 < (long)this->nb_months) {
          local_88.average = dVar18 / (double)((long)this->nb_months + -1);
        }
        iVar3._M_current = *(_metric_name_line **)((long)p_Var14 + 8);
        if (iVar3._M_current == *(_metric_name_line **)((long)p_Var14 + 0x10)) {
          std::vector<_metric_name_line,std::allocator<_metric_name_line>>::
          _M_realloc_insert<_metric_name_line_const&>
                    ((vector<_metric_name_line,std::allocator<_metric_name_line>> *)p_Var14,iVar3,
                     &local_88);
        }
        else {
          (iVar3._M_current)->average = local_88.average;
          (iVar3._M_current)->name = local_88.name;
          (iVar3._M_current)->current = local_88.current;
          *(long *)((long)p_Var14 + 8) = *(long *)((long)p_Var14 + 8) + 0x18;
        }
        local_88.name =
             (this->line_list).super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar13]->key_value;
        local_88.current = 0.0;
        local_88.average = 0.0;
        dVar18 = 0.0;
      }
      p_Var2 = (this->line_list).super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar13];
      if ((p_Var2->year == this->last_year) && (p_Var2->month == this->last_month)) {
        local_88.current = p_Var2->frequency;
      }
      else {
        dVar18 = dVar18 + p_Var2->frequency;
      }
      uVar13 = uVar13 + 1;
      pp_Var10 = (this->line_list).
                 super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(this->line_list).
                                    super__Vector_base<_metric_line_*,_std::allocator<_metric_line_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pp_Var10 >> 3
                             ));
  }
  if (local_88.name != (char *)0x0) {
    if (1 < (long)this->nb_months) {
      local_88.average = dVar18 / (double)((long)this->nb_months + -1);
    }
    iVar3._M_current = *(_metric_name_line **)((long)p_Var14 + 8);
    if (iVar3._M_current == *(_metric_name_line **)((long)p_Var14 + 0x10)) {
      std::vector<_metric_name_line,std::allocator<_metric_name_line>>::
      _M_realloc_insert<_metric_name_line_const&>
                ((vector<_metric_name_line,std::allocator<_metric_name_line>> *)p_Var14,iVar3,
                 &local_88);
    }
    else {
      (iVar3._M_current)->average = local_88.average;
      (iVar3._M_current)->name = local_88.name;
      (iVar3._M_current)->current = local_88.current;
      *(long *)((long)p_Var14 + 8) = *(long *)((long)p_Var14 + 8) + 0x18;
    }
  }
  __first._M_current = *p_Var14;
  _Var17._M_current = *(_metric_name_line **)((long)p_Var14 + 8);
  if ((char)local_60 == '\0') {
    if (__first._M_current != _Var17._M_current) {
      uVar13 = ((long)_Var17._M_current - (long)__first._M_current >> 3) * -0x5555555555555555;
      lVar6 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<_metric_name_line*,std::vector<_metric_name_line,std::allocator<_metric_name_line>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_metric_name_line,_metric_name_line)>>
                (__first,_Var17,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(_metric_name_line,__metric_name_line)>)0x166a94);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<_metric_name_line*,std::vector<_metric_name_line,std::allocator<_metric_name_line>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_metric_name_line,_metric_name_line)>>
                (__first,_Var17,
                 (_Iter_comp_iter<bool_(*)(_metric_name_line,__metric_name_line)>)0x166a94);
    }
  }
  else if (__first._M_current != _Var17._M_current) {
    uVar13 = ((long)_Var17._M_current - (long)__first._M_current >> 3) * -0x5555555555555555;
    lVar6 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<_metric_name_line*,std::vector<_metric_name_line,std::allocator<_metric_name_line>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(_metric_name_line,_metric_name_line)>>
              (__first,_Var17,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(_metric_name_line,__metric_name_line)>)0x166ae8);
    local_68 = __first._M_current;
    local_38 = _Var17._M_current;
    if ((long)_Var17._M_current - (long)__first._M_current < 0x181) {
      p_Var14 = __first._M_current + 1;
      _Var15._M_current = __first._M_current;
      if (__first._M_current + 1 != _Var17._M_current) {
        do {
          p_Var16 = p_Var14;
          pcVar4 = (__first._M_current)->name;
          pcVar5 = _Var15._M_current[1].name;
          iVar8 = atoi(pcVar5);
          iVar9 = atoi(pcVar4);
          if (iVar8 < iVar9) {
            local_48 = p_Var16->average;
            local_58 = p_Var16->name;
            dStack_50 = p_Var16->current;
            memmove((void *)((long)_Var15._M_current +
                            (0x30 - ((long)p_Var16 - (long)__first._M_current))),__first._M_current,
                    (long)p_Var16 - (long)__first._M_current);
            (__first._M_current)->name = local_58;
            (__first._M_current)->current = dStack_50;
            (__first._M_current)->average = local_48;
          }
          else {
            local_58 = (char *)p_Var16->current;
            dStack_50 = p_Var16->average;
            iVar9 = atoi((_Var15._M_current)->name);
            p_Var12 = p_Var16;
            p_Var14 = p_Var16;
            if (iVar8 < iVar9) {
              do {
                p_Var14 = p_Var12 + -1;
                p_Var12->average = p_Var12[-1].average;
                dVar18 = p_Var12[-1].current;
                p_Var12->name = p_Var12[-1].name;
                p_Var12->current = dVar18;
                pcVar4 = p_Var12[-2].name;
                iVar8 = atoi(pcVar5);
                iVar9 = atoi(pcVar4);
                p_Var12 = p_Var14;
              } while (iVar8 < iVar9);
            }
            p_Var14->name = pcVar5;
            p_Var14->current = (double)local_58;
            p_Var14->average = dStack_50;
            __first._M_current = local_68;
          }
          p_Var14 = p_Var16 + 1;
          _Var15._M_current = p_Var16;
        } while (p_Var16 + 1 != local_38);
      }
    }
    else {
      __n = 0x18;
      _Var15._M_current = __first._M_current;
      _Var17._M_current = __first._M_current;
      do {
        local_60 = _Var17._M_current + 1;
        p_Var14 = (_metric_name_line *)((long)&(__first._M_current)->name + __n);
        pcVar4 = (__first._M_current)->name;
        pcVar5 = *(char **)((long)&(__first._M_current)->name + __n);
        iVar8 = atoi(pcVar5);
        iVar9 = atoi(pcVar4);
        if (iVar8 < iVar9) {
          local_48 = p_Var14->average;
          local_58 = p_Var14->name;
          dStack_50 = p_Var14->current;
          memmove((void *)((long)_Var15._M_current + (0x30 - __n)),__first._M_current,__n);
          (__first._M_current)->name = local_58;
          (__first._M_current)->current = dStack_50;
          (__first._M_current)->average = local_48;
          _Var17._M_current = local_60;
        }
        else {
          local_58 = (char *)p_Var14->current;
          dStack_50 = p_Var14->average;
          iVar9 = atoi((_Var15._M_current)->name);
          _Var17._M_current = local_60;
          p_Var12 = local_60;
          p_Var16 = p_Var14;
          if (iVar8 < iVar9) {
            do {
              p_Var16 = p_Var12 + -1;
              p_Var12->average = p_Var12[-1].average;
              dVar18 = p_Var12[-1].current;
              p_Var12->name = p_Var12[-1].name;
              p_Var12->current = dVar18;
              pcVar4 = p_Var12[-2].name;
              iVar8 = atoi(pcVar5);
              iVar9 = atoi(pcVar4);
              p_Var12 = p_Var16;
            } while (iVar8 < iVar9);
          }
          p_Var16->name = pcVar5;
          p_Var16->current = (double)local_58;
          p_Var16->average = dStack_50;
          __first._M_current = local_68;
        }
        p_Var16 = local_38;
        __n = __n + 0x18;
        _Var15._M_current = p_Var14;
      } while (__n != 0x180);
      for (p_Var14 = __first._M_current + 0x10; p_Var14 != p_Var16; p_Var14 = p_Var14 + 1) {
        pcVar4 = p_Var14->name;
        local_58 = (char *)p_Var14->current;
        dStack_50 = p_Var14->average;
        pcVar5 = p_Var14[-1].name;
        iVar8 = atoi(pcVar4);
        iVar9 = atoi(pcVar5);
        p_Var11 = p_Var14;
        p_Var12 = p_Var14;
        if (iVar8 < iVar9) {
          do {
            p_Var12 = p_Var11 + -1;
            p_Var11->average = p_Var11[-1].average;
            dVar18 = p_Var11[-1].current;
            p_Var11->name = p_Var11[-1].name;
            p_Var11->current = dVar18;
            pcVar5 = p_Var11[-2].name;
            iVar8 = atoi(pcVar4);
            iVar9 = atoi(pcVar5);
            p_Var11 = p_Var12;
          } while (iVar8 < iVar9);
        }
        p_Var12->name = pcVar4;
        p_Var12->current = (double)local_58;
        p_Var12->average = dStack_50;
      }
    }
  }
  return true;
}

Assistant:

bool ithipublisher::GetNameOrNumberList(char const * metric_name, std::vector<MetricNameLine>* name_list, bool is_number)
{
    size_t line_index = 0;
    double sum = 0;
    MetricNameLine current_name = { NULL, 0, 0 };

    /* Skip to beginning of the metric */
    while (line_index < line_list.size())
    {
        int cmp = strcmp(line_list[line_index]->metric_name, metric_name);

        if (cmp > 0)
        {
            break;
        }
        else if (cmp == 0)
        {
            current_name.name = line_list[line_index]->key_value;
            break;
        }
        line_index++;
    }

    /* Extract the lines and compute the averages */
    while (line_index < line_list.size() && strcmp(line_list[line_index]->metric_name, metric_name) == 0)
    {
        if (current_name.name != NULL && strcmp(line_list[line_index]->key_value, current_name.name) != 0)
        {
            if (nb_months > 1)
            {
                current_name.average = sum / (((size_t)nb_months) - 1);
            }
            name_list->push_back(current_name);
            current_name.name = line_list[line_index]->key_value;
            current_name.average = 0;
            current_name.current = 0;
            sum = 0;
        }
        
        if (line_list[line_index]->year == last_year &&
            line_list[line_index]->month == last_month)
        {
            current_name.current = line_list[line_index]->frequency;
        }
        else
        {
            sum += line_list[line_index]->frequency;
        }

        line_index++;
    }
    /* Push the last entry if it was filled up */
    if (current_name.name != NULL)
    {
        if (nb_months > 1)
        {
            current_name.average = sum / (((size_t)nb_months) - 1);
        }
        name_list->push_back(current_name);
    }

    if (is_number) {
        /* Sort by increasing metric number */
        std::sort(name_list->begin(), name_list->end(), ithipublisher::MetricNumberIsLower);
    } else {
        /* Sort from bigger to lower */
        std::sort(name_list->begin(), name_list->end(), ithipublisher::MetricNameLineIsBigger);
    }

    return true;
}